

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O2

Time __thiscall libwebvtt::Time::operator+(Time *this,presentation_t d)

{
  Time TVar1;
  Time t;
  Time local_18;
  
  local_18.hours = this->hours;
  local_18.minutes = this->minutes;
  local_18.seconds = this->seconds;
  local_18.milliseconds = this->milliseconds;
  operator+=(&local_18,d);
  TVar1.seconds = local_18.seconds;
  TVar1.milliseconds = local_18.milliseconds;
  TVar1.hours = local_18.hours;
  TVar1.minutes = local_18.minutes;
  return TVar1;
}

Assistant:

Time Time::operator+(presentation_t d) const {
  Time t(*this);
  t += d;
  return t;
}